

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop.cpp
# Opt level: O1

void __thiscall uv11::Loop::~Loop(Loop *this)

{
  int s;
  int *piVar1;
  error_code eVar2;
  
  if (this->is_default == false) {
    s = uv_loop_close();
    if (s < 0) {
      piVar1 = (int *)__cxa_allocate_exception(0x10);
      eVar2 = make_error(s);
      *piVar1 = eVar2._M_value;
      *(error_category **)(piVar1 + 2) = eVar2._M_cat;
      __cxa_throw(piVar1,&std::error_code::typeinfo,0);
    }
  }
  return;
}

Assistant:

Loop::~Loop() {
    if (!is_default) {
        int s = ::uv_loop_close(&loop);
        if (s < 0) throw make_error(s);
    }
}